

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsetTests.cpp
# Opt level: O0

void __thiscall IsIterableNotContainingSubsetTests::Run(IsIterableNotContainingSubsetTests *this)

{
  anon_class_1_0_00000001 local_1f9;
  function<void_()> local_1f8;
  allocator local_1d1;
  string local_1d0 [39];
  anon_class_1_0_00000001 local_1a9;
  function<void_()> local_1a8;
  allocator local_181;
  string local_180 [39];
  anon_class_1_0_00000001 local_159;
  function<void_()> local_158;
  allocator local_131;
  string local_130 [39];
  anon_class_1_0_00000001 local_109;
  function<void_()> local_108;
  allocator local_e1;
  string local_e0 [39];
  anon_class_1_0_00000001 local_b9;
  function<void_()> local_b8;
  allocator local_91;
  string local_90 [39];
  anon_class_1_0_00000001 local_69;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  IsIterableNotContainingSubsetTests *local_10;
  IsIterableNotContainingSubsetTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a vector containing the passed int is not true",&local_31);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_69);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"a vector containing an equivalent set of the passed set is not true",
             &local_91);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_2_,void>
            ((function<void()> *)&local_b8,&local_b9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_90,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"a vector not containing the passed int is not false",&local_e1);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_3_,void>
            ((function<void()> *)&local_108,&local_109);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_e0,&local_108);
  std::function<void_()>::~function(&local_108);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,"a vector containing a subset of the passed set is not false",&local_131);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_4_,void>
            ((function<void()> *)&local_158,&local_159);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_130,&local_158);
  std::function<void_()>::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"Is::Iterable::Containing::Subset() is an operand",&local_181);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_5_,void>
            ((function<void()> *)&local_1a8,&local_1a9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_180,&local_1a8);
  std::function<void_()>::~function(&local_1a8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,"Is::Iterable::Containing::Subset() has an error message",&local_1d1);
  std::function<void()>::function<IsIterableNotContainingSubsetTests::Run()::_lambda()_6_,void>
            ((function<void()> *)&local_1f8,&local_1f9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1d0,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector containing the passed int is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,2}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector containing an equivalent set of the passed set is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector not containing the passed int is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,8}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("a vector containing a subset of the passed set is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5,6}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("Is::Iterable::Containing::Subset() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Not::Containing::Subset(5)) >::value, ut11::Is::True);
		});

		Then("Is::Iterable::Containing::Subset() has an error message", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(5).GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}